

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O1

void __thiscall soplex::SPxSteepPR<double>::removedVec(SPxSteepPR<double> *this,int i)

{
  SPxSolverBase<double> *pSVar1;
  pointer pdVar2;
  
  pSVar1 = (this->super_SPxPricer<double>).thesolver;
  pdVar2 = (pSVar1->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2[i] = pdVar2[(int)((ulong)((long)(pSVar1->weights).val.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_finish - (long)pdVar2) >> 3)];
  VectorBase<double>::reDim(&pSVar1->weights,(pSVar1->thevectors->set).thenum,true);
  return;
}

Assistant:

void SPxSteepPR<R>::removedVec(int i)
{
   assert(this->thesolver != nullptr);
   VectorBase<R>& weights = this->thesolver->weights;
   weights[i] = weights[weights.dim()];
   weights.reDim(this->thesolver->coDim());
}